

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteCord
          (CopyingOutputStreamAdaptor *this,Cord *cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ChunkIterator __begin2;
  ChunkIterator local_b8;
  
  local_b8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_b8.bytes_remaining_ = 0;
  local_b8.current_chunk_ = (string_view)ZEXT816(0);
  local_b8.btree_reader_.remaining_ = 0;
  local_b8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_001688c3;
    local_b8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_b8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_b8.current_chunk_._M_len = local_b8.bytes_remaining_;
  }
  else {
    local_b8.bytes_remaining_ = tree->length;
    if (local_b8.bytes_remaining_ == 0) {
      return true;
    }
    absl::lts_20240722::Cord::ChunkIterator::InitTree(&local_b8,tree);
  }
  if (local_b8.bytes_remaining_ == 0) {
    return true;
  }
  sVar3 = local_b8.current_chunk_._M_len;
  while( true ) {
    iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[5])
                      (this,local_b8.current_chunk_._M_str,sVar3 & 0xffffffff);
    if ((char)iVar2 == '\0') {
      return false;
    }
    if (local_b8.bytes_remaining_ == 0) break;
    sVar4 = local_b8.bytes_remaining_ - local_b8.current_chunk_._M_len;
    if (local_b8.bytes_remaining_ < local_b8.current_chunk_._M_len) goto LAB_001688c8;
    sVar3 = local_b8.bytes_remaining_;
    local_b8.bytes_remaining_ = sVar4;
    if (sVar4 != 0) {
      if (((long)local_b8.btree_reader_.navigator_.height_ < 0) ||
         (local_b8.btree_reader_.navigator_.node_[local_b8.btree_reader_.navigator_.height_] ==
          (CordRepBtree *)0x0)) {
        if (local_b8.current_chunk_._M_len == 0) {
          __assert_fail("!current_chunk_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        local_b8.current_chunk_ = (string_view)ZEXT816(0);
        sVar3 = 0;
      }
      else {
        local_b8.current_chunk_ =
             absl::lts_20240722::cord_internal::CordRepBtreeReader::Next(&local_b8.btree_reader_);
        sVar3 = local_b8.current_chunk_._M_len;
      }
    }
    if (local_b8.bytes_remaining_ == 0) {
      return (bool)(char)iVar2;
    }
  }
  WriteCord();
LAB_001688c3:
  WriteCord();
LAB_001688c8:
  __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteCord(const absl::Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    if (!WriteAliasedRaw(chunk.data(), chunk.size())) {
      return false;
    }
  }
  return true;
}